

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::AddMissingPDUSequenceNumber
          (Minefield_Response_NACK_PDU *this,KUINT8 N)

{
  pointer *ppuVar1;
  KUINT16 *pKVar2;
  iterator __position;
  KUINT8 local_9;
  
  __position._M_current =
       (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_9 = N;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_realloc_insert<unsigned_char_const&>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vSeqNums,__position,
               &local_9);
  }
  else {
    *__position._M_current = N;
    ppuVar1 = &(this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  this->m_ui8NumMisPdus = this->m_ui8NumMisPdus + '\x01';
  pKVar2 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar2 = *pKVar2 + 1;
  return;
}

Assistant:

void Minefield_Response_NACK_PDU::AddMissingPDUSequenceNumber( KUINT8 N )
{
    m_vSeqNums.push_back( N );
    ++m_ui8NumMisPdus;
    ++m_ui16PDULength;
}